

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::ObservableEvents_DataSourceInstanceStateChange::
ObservableEvents_DataSourceInstanceStateChange(ObservableEvents_DataSourceInstanceStateChange *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__ObservableEvents_DataSourceInstanceStateChange_003c6fd0;
  (this->producer_name_)._M_dataplus._M_p = (pointer)&(this->producer_name_).field_2;
  (this->producer_name_)._M_string_length = 0;
  (this->producer_name_).field_2._M_local_buf[0] = '\0';
  (this->data_source_name_)._M_dataplus._M_p = (pointer)&(this->data_source_name_).field_2;
  (this->data_source_name_)._M_string_length = 0;
  (this->data_source_name_).field_2._M_local_buf[0] = '\0';
  this->state_ = 0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

ObservableEvents_DataSourceInstanceStateChange::ObservableEvents_DataSourceInstanceStateChange() = default;